

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O3

int cpu_exec_m68k(uc_struct_conflict3 *uc,CPUState *cpu)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  CPUClass *pCVar4;
  TranslationBlock *pTVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var9;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var10;
  CPUWatchpoint *pCVar11;
  _Bool _Var12;
  char cVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  TranslationBlock *pTVar20;
  TranslationBlock_conflict *pTVar21;
  TranslationBlock_conflict *pTVar22;
  uint cf_mask;
  CPUClass *pCVar23;
  TranslationBlock_conflict *pTVar24;
  uint32_t cflags;
  list_item *plVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  ulong local_50;
  undefined4 local_48;
  ulong local_40;
  undefined4 local_38;
  
  pCVar23 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar23->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var12 = (*pCVar23->has_work)((CPUState_conflict *)cpu);
    if (!_Var12) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar23->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar14 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar14 != 0) {
    pCVar23 = cpu->cc;
  }
LAB_006e0bfc:
  puVar2 = cpu->uc;
  uVar17 = cpu->exception_index;
  if (puVar2->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var12 = (*puVar2->stop_interrupt)(puVar2,uVar17);
    if (_Var12) {
      plVar25 = puVar2->hook[0xe].head;
      goto joined_r0x006e12cf;
    }
    uVar17 = cpu->exception_index;
  }
  if (-1 < (int)uVar17) {
    if (0xffff < uVar17) {
      if (uVar17 == 0x10002) {
        pCVar4 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          for (pCVar11 = (cpu->watchpoints).tqh_first; pCVar11 != (CPUWatchpoint *)0x0;
              pCVar11 = (pCVar11->entry).tqe_next) {
            *(byte *)&pCVar11->flags = (byte)pCVar11->flags & 0x3f;
          }
        }
        (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_006e135a;
    }
    plVar25 = puVar2->hook[0].head;
    if (plVar25 == (list_item *)0x0) goto LAB_006e12ae;
    bVar26 = false;
    do {
      pvVar3 = plVar25->data;
      if (pvVar3 == (void *)0x0) break;
      if (*(char *)((long)pvVar3 + 0x14) == '\0') {
        (**(code **)((long)pvVar3 + 0x28))
                  (puVar2,cpu->exception_index,*(undefined8 *)((long)pvVar3 + 0x30));
        bVar26 = true;
      }
      plVar25 = plVar25->next;
    } while (plVar25 != (list_item *)0x0);
    if (!bVar26) goto LAB_006e12ae;
    cpu->exception_index = -1;
  }
  pTVar22 = (TranslationBlock_conflict *)0x0;
  pTVar21 = pTVar22;
  while( true ) {
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x46a) = 0;
    uVar17 = cpu->interrupt_request;
    if (uVar17 != 0) {
      uVar15 = uVar17;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar15 = uVar17 & 0xffffeda5;
      }
      if ((char)uVar15 < '\0') {
        cpu->interrupt_request = uVar17 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_006e0bfc;
      }
      if ((uVar15 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_006e0bfc;
      }
      _Var12 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar15);
      if (_Var12) {
        cpu->exception_index = -1;
        pTVar21 = (TranslationBlock_conflict *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar21 = (TranslationBlock_conflict *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    cflags = cpu->cflags_next_tb;
    if (cflags == 0xffffffff) {
      cflags = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    pvVar3 = cpu->env_ptr;
    uVar17 = *(uint *)((long)pvVar3 + 0x40);
    uVar15 = *(uint *)((long)pvVar3 + 0x138) >> 4 & 0xf;
    if ((*(byte *)((long)pvVar3 + 0x45) & 0x20) != 0) {
      uVar15 = uVar15 + ((*(uint *)((long)pvVar3 + 0x180) & 4) << 0xd |
                        (*(uint *)((long)pvVar3 + 0x17c) & 4) << 0xc) + 0x2000;
    }
    puVar2 = cpu->uc;
    uVar16 = uVar17 >> 6 ^ uVar17;
    uVar16 = uVar16 & 0x3f | uVar16 >> 6 & 0xfc0;
    pTVar20 = cpu->tb_jmp_cache[uVar16];
    cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
    if (((((pTVar20 == (TranslationBlock *)0x0) || ((uint)pTVar20->pc != uVar17)) ||
         (*(int *)((long)&pTVar20->pc + 4) != 0)) ||
        (((uint32_t)pTVar20->cs_base != uVar15 ||
         (uVar1._0_2_ = pTVar20->size, uVar1._2_2_ = pTVar20->icount,
         cpu->trace_dstate[0] != (ulong)uVar1)))) || ((pTVar20->flags & 0xff0effff) != cf_mask)) {
      pTVar20 = tb_htable_lookup_m68k(cpu,(ulong)uVar17,0,uVar15,cf_mask);
      if (pTVar20 == (TranslationBlock *)0x0) {
        pTVar20 = (TranslationBlock *)tb_gen_code_m68k(cpu,uVar17,0,uVar15,cflags);
        cpu->tb_jmp_cache[uVar16] = pTVar20;
        pTVar5 = puVar2->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar20->pc;
          auVar27 = ZEXT416(*(uint *)((long)&pTVar20->cs_base + 4));
          auVar27 = pshuflw(auVar27,auVar27,0xe1);
          local_38 = auVar27._0_4_;
          local_50 = (ulong)(uint)pTVar5->pc;
          auVar27 = ZEXT416(*(uint *)((long)&pTVar5->cs_base + 4));
          auVar27 = pshuflw(auVar27,auVar27,0xe1);
          local_48 = auVar27._0_4_;
          for (plVar25 = puVar2->hook[0xf].head;
              (plVar25 != (list_item *)0x0 && (pvVar3 = plVar25->data, pvVar3 != (void *)0x0));
              plVar25 = plVar25->next) {
            if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
               (uVar18 = (ulong)(uint)pTVar20->pc,
               *(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
               uVar18 <= *(ulong *)((long)pvVar3 + 0x20) &&
               *(ulong *)((long)pvVar3 + 0x18) <= uVar18)) {
              (**(code **)((long)pvVar3 + 0x28))
                        (puVar2,&local_40,&local_50,*(undefined8 *)((long)pvVar3 + 0x30));
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar16] = pTVar20;
      }
    }
    if ((pTVar21 != (TranslationBlock_conflict *)0x0) &&
       (pTVar20->page_addr[0] == 0xffffffffffffffff)) {
      if (1 < (uint)pTVar22) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar20->flags & 0x40000) == 0) {
        LOCK();
        bVar26 = pTVar21->jmp_dest[(long)pTVar22] == 0;
        if (bVar26) {
          pTVar21->jmp_dest[(long)pTVar22] = (uintptr_t)pTVar20;
        }
        UNLOCK();
        if (bVar26) {
          pvVar3 = (pTVar21->tc).ptr;
          *(uint32_t *)(pTVar21->jmp_target_arg[(long)pTVar22] + (long)pvVar3) =
               (pTVar20->cflags - ((int)pTVar21->jmp_target_arg[(long)pTVar22] + (int)pvVar3)) + -4;
          pTVar21->jmp_list_next[(long)pTVar22] = pTVar20->jmp_target_arg[1];
          pTVar20->jmp_target_arg[1] = (ulong)pTVar21 | (ulong)pTVar22;
        }
      }
    }
    if (cpu->exit_request == false) {
      uVar6._0_4_ = pTVar20->cflags;
      uVar6._4_4_ = pTVar20->trace_vcpu_dstate;
      pvVar3 = cpu->env_ptr;
      tb_exec_lock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
      uVar18 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x218) + 0x2e8) + 0x90))
                         (pvVar3,uVar6);
      if (cpu->uc->nested_level == 1) {
        tb_exec_unlock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
      }
      cpu->can_do_io = 1;
      pTVar24 = (TranslationBlock_conflict *)(uVar18 & 0xfffffffffffffffc);
      if ((uVar18 & 2) != 0) {
        if (*(long *)(*(long *)((long)pvVar3 + 0x218) + 0x358) == 0) {
          uVar17 = *(uint *)(*(long *)((long)pvVar3 + 0x218) + 0x578);
          if (((0x12 < uVar17) || ((0x771c0U >> (uVar17 & 0x1f) & 1) == 0)) &&
             (cpu->uc->quit_request == false)) {
            p_Var9 = cpu->cc->synchronize_from_tb;
            if (p_Var9 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
              p_Var10 = cpu->cc->set_pc;
              if (p_Var10 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_006e13ac;
              (*p_Var10)((CPUState_conflict *)cpu,(ulong)pTVar24->pc);
            }
            else {
              (*p_Var9)((CPUState_conflict *)cpu,pTVar24);
            }
          }
        }
        cpu->tcg_exit_req = 0;
      }
      cpu->uc->last_tb = pTVar20;
      uVar17 = (uint)uVar18 & 3;
      pTVar22 = (TranslationBlock_conflict *)(ulong)uVar17;
      pTVar21 = pTVar24;
      if ((uVar17 == 3) &&
         (pTVar22 = (TranslationBlock_conflict *)0x3, pTVar21 = (TranslationBlock_conflict *)0x0,
         -1 < *(int *)(cpu[1].tb_jmp_cache + 0x8d))) {
        lVar7 = cpu->icount_budget;
        lVar19 = 0xffff;
        if (lVar7 < 0xffff) {
          lVar19 = lVar7;
        }
        uVar17 = (uint)lVar19;
        *(short *)(cpu[1].tb_jmp_cache + 0x8d) = (short)lVar19;
        cpu->icount_extra = lVar7 - (int)uVar17;
        pTVar21 = (TranslationBlock_conflict *)0x0;
        pTVar22 = (TranslationBlock_conflict *)0x3;
        if (0 < (int)uVar17 && lVar7 - (int)uVar17 == 0) {
          uVar15 = 0x7fff;
          if (uVar17 < 0x7fff) {
            uVar15 = uVar17;
          }
          pTVar20 = (TranslationBlock *)
                    tb_gen_code_m68k(cpu,pTVar24->pc,pTVar24->cs_base,pTVar24->flags,
                                     uVar15 | 0x10000);
          (pTVar20->tc).size = (size_t)pTVar24;
          uVar8._0_4_ = pTVar20->cflags;
          uVar8._4_4_ = pTVar20->trace_vcpu_dstate;
          pvVar3 = cpu->env_ptr;
          tb_exec_lock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
          uVar18 = (**(code **)(*(long *)(*(long *)((long)pvVar3 + 0x218) + 0x2e8) + 0x90))
                             (pvVar3,uVar8);
          if (cpu->uc->nested_level == 1) {
            tb_exec_unlock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
          }
          cpu->can_do_io = 1;
          if ((uVar18 & 2) != 0) {
            if (*(long *)(*(long *)((long)pvVar3 + 0x218) + 0x358) == 0) {
              uVar17 = *(uint *)(*(long *)((long)pvVar3 + 0x218) + 0x578);
              if (((0x12 < uVar17) || ((0x771c0U >> (uVar17 & 0x1f) & 1) == 0)) &&
                 (cpu->uc->quit_request == false)) {
                p_Var9 = cpu->cc->synchronize_from_tb;
                if (p_Var9 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                  p_Var10 = cpu->cc->set_pc;
                  if (p_Var10 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_006e13ac:
                    __assert_fail("cc->set_pc",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                  ,0x61,
                                  "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
                  }
                  (*p_Var10)((CPUState_conflict *)cpu,
                             (ulong)((TranslationBlock_conflict *)(uVar18 & 0xfffffffffffffffc))->pc
                            );
                }
                else {
                  (*p_Var9)((CPUState_conflict *)cpu,
                            (TranslationBlock_conflict *)(uVar18 & 0xfffffffffffffffc));
                }
              }
            }
            cpu->tcg_exit_req = 0;
          }
          tb_phys_invalidate_m68k
                    ((TCGContext_conflict2 *)cpu->uc->tcg_ctx,(TranslationBlock_conflict *)pTVar20,
                     0xffffffffffffffff);
          tcg_tb_remove_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx,pTVar20);
          pTVar21 = (TranslationBlock_conflict *)0x0;
          pTVar22 = (TranslationBlock_conflict *)0x3;
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_006e0bfc;
joined_r0x006e12cf:
  if ((plVar25 == (list_item *)0x0) || (pvVar3 = plVar25->data, pvVar3 == (void *)0x0))
  goto LAB_006e12f9;
  if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
     (cVar13 = (**(code **)((long)pvVar3 + 0x28))(puVar2,*(undefined8 *)((long)pvVar3 + 0x30)),
     cVar13 != '\0')) goto LAB_006e1304;
  plVar25 = plVar25->next;
  goto joined_r0x006e12cf;
LAB_006e12f9:
  puVar2->invalid_error = 10;
  goto LAB_006e1304;
LAB_006e12ae:
  puVar2->invalid_error = 0x15;
  cpu->halted = 1;
LAB_006e1304:
  uVar17 = 0x10001;
LAB_006e135a:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar23->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar17;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}